

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

void Aig_ManSuppCharAdd(uint *pBuffer,Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (vOne->nSize <= i) {
      return;
    }
    iVar1 = Vec_IntEntry(vOne,i);
    if (nPis <= iVar1) break;
    pBuffer[iVar1 >> 5] = pBuffer[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
    i = i + 1;
  }
  __assert_fail("Entry < nPis",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0x1f5,"void Aig_ManSuppCharAdd(unsigned int *, Vec_Int_t *, int)");
}

Assistant:

void Aig_ManSuppCharAdd( unsigned * pBuffer, Vec_Int_t * vOne, int nPis )
{
    int i, Entry;
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
}